

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O0

bool __thiscall
BaseNode::IsAlreadyConnectedWithPendingConnection
          (BaseNode *this,char *current_slot_title,int current_slot_kind)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference pCVar4;
  Connection *conn_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Connection,_std::allocator<Connection>_> *__range3_1;
  Connection *conn;
  iterator __end3;
  iterator __begin3;
  vector<Connection,_std::allocator<Connection>_> *__range3;
  char *pcStack_38;
  int other_slot_kind;
  char *other_slot_title;
  void *other_node_id;
  char *pcStack_20;
  int current_slot_kind_local;
  char *current_slot_title_local;
  BaseNode *this_local;
  
  other_node_id._4_4_ = current_slot_kind;
  pcStack_20 = current_slot_title;
  current_slot_title_local = (char *)this;
  bVar1 = ImNodes::GetPendingConnection
                    (&other_slot_title,&stack0xffffffffffffffc8,(int *)((long)&__range3 + 4));
  if (bVar1) {
    bVar1 = ImNodes::IsInputSlotKind(other_node_id._4_4_);
    bVar2 = ImNodes::IsInputSlotKind(__range3._4_4_);
    if (bVar1 == bVar2) {
      __assert_fail("ImNodes::IsInputSlotKind(current_slot_kind) != ImNodes::IsInputSlotKind(other_slot_kind)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/nodes.cpp"
                    ,0x12a,
                    "bool BaseNode::IsAlreadyConnectedWithPendingConnection(const char *, int)");
    }
    bVar1 = ImNodes::IsInputSlotKind(__range3._4_4_);
    if (bVar1) {
      __end3 = std::vector<Connection,_std::allocator<Connection>_>::begin(&this->connections);
      conn = (Connection *)
             std::vector<Connection,_std::allocator<Connection>_>::end(&this->connections);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                                         *)&conn), bVar1) {
        pCVar4 = __gnu_cxx::
                 __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                 ::operator*(&__end3);
        if (((((char *)pCVar4->input_node == other_slot_title) &&
             (iVar3 = strcmp(pCVar4->input_slot,pcStack_38), iVar3 == 0)) &&
            ((BaseNode *)pCVar4->output_node == this)) &&
           (iVar3 = strcmp(pCVar4->output_slot,pcStack_20), iVar3 == 0)) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
        operator++(&__end3);
      }
    }
    else {
      __end3_1 = std::vector<Connection,_std::allocator<Connection>_>::begin(&this->connections);
      conn_1 = (Connection *)
               std::vector<Connection,_std::allocator<Connection>_>::end(&this->connections);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                                 *)&conn_1), bVar1) {
        pCVar4 = __gnu_cxx::
                 __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>
                 ::operator*(&__end3_1);
        if ((((BaseNode *)pCVar4->input_node == this) &&
            (iVar3 = strcmp(pCVar4->input_slot,pcStack_20), iVar3 == 0)) &&
           (((char *)pCVar4->output_node == other_slot_title &&
            (iVar3 = strcmp(pCVar4->output_slot,pcStack_38), iVar3 == 0)))) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<Connection_*,_std::vector<Connection,_std::allocator<Connection>_>_>::
        operator++(&__end3_1);
      }
    }
  }
  return false;
}

Assistant:

bool IsAlreadyConnectedWithPendingConnection(const char* current_slot_title, int current_slot_kind)
    {
        void* other_node_id;
        const char* other_slot_title;
        int other_slot_kind;
        if (ImNodes::GetPendingConnection(&other_node_id, &other_slot_title, &other_slot_kind))
        {
            assert(ImNodes::IsInputSlotKind(current_slot_kind) != ImNodes::IsInputSlotKind(other_slot_kind));

            if (ImNodes::IsInputSlotKind(other_slot_kind))
            {
                for (const auto& conn : connections)
                {
                    if (conn.input_node == other_node_id && strcmp(conn.input_slot, other_slot_title) == 0 &&
                        conn.output_node == this && strcmp(conn.output_slot, current_slot_title) == 0)
                        return true;
                }
            }
            else
            {
                for (const auto& conn : connections)
                {
                    if (conn.input_node == this && strcmp(conn.input_slot, current_slot_title) == 0 &&
                        conn.output_node == other_node_id && strcmp(conn.output_slot, other_slot_title) == 0)
                        return true;
                }
            }
        }
        return false;
    }